

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

Maybe<capnp::Schema> __thiscall
capnp::SchemaLoader::tryGet(SchemaLoader *this,uint64_t id,Reader brand,Schema scope)

{
  Own<capnp::SchemaLoader::Impl> *pOVar1;
  Reader proto;
  RawSchema *schema;
  RawBrandedSchema *this_00;
  long in_RCX;
  Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> MVar2;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<capnp::Schema>_2 aVar3;
  LazyLoadCallback *c;
  TryGetResult TVar4;
  Maybe<capnp::Schema> MVar5;
  Reader local_80;
  long local_50;
  Maybe<kj::ArrayPtr<const_capnp::_::RawBrandedSchema::Scope>_> local_48;
  
  local_50 = in_RCX;
  kj::_::Mutex::lock((Mutex *)id,SHARED);
  pOVar1 = (Own<capnp::SchemaLoader::Impl> *)(id + 0x18);
  local_80.reader.segment = (SegmentReader *)id;
  local_80.reader.capTable = (CapTableReader *)pOVar1;
  TVar4 = Impl::tryGet(*(Impl **)(id + 0x20),(uint64_t)scope.raw);
  MVar2 = TVar4.callback.ptr;
  schema = TVar4.schema;
  kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
            ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)&local_80);
  if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
    if (MVar2.ptr != (LazyLoadCallback *)0x0) {
      (*(code *)**(undefined8 **)MVar2.ptr)(MVar2.ptr,id,scope.raw);
    }
    kj::_::Mutex::lock((Mutex *)id,SHARED);
    local_80.reader.segment = (SegmentReader *)id;
    local_80.reader.capTable = (CapTableReader *)pOVar1;
    TVar4 = Impl::tryGet(*(Impl **)(id + 0x20),(uint64_t)scope.raw);
    schema = TVar4.schema;
    kj::Locked<const_kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
              ((Locked<const_kj::Own<capnp::SchemaLoader::Impl>_> *)&local_80);
    if ((schema == (RawSchema *)0x0) || (schema->lazyInitializer != (Initializer *)0x0)) {
      *(undefined1 *)&(this->impl).mutex.futex = 0;
      aVar3 = extraout_RDX;
      goto LAB_00170040;
    }
  }
  capnp::schema::Brand::Reader::getScopes(&local_80,&brand);
  if (local_80.reader.elementCount == 0) {
    *(undefined1 *)&(this->impl).mutex.futex = 1;
    (this->impl).mutex.waitersHead.ptr = (Waiter *)&schema->defaultBrand;
    aVar3 = extraout_RDX_00;
  }
  else {
    kj::_::Mutex::lock((Mutex *)id,EXCLUSIVE);
    local_48.ptr.field_1.value.ptr = (Scope *)*(undefined8 *)(local_50 + 8);
    local_48.ptr.field_1.value.size_ = (size_t)*(uint *)(local_50 + 0x18);
    local_48.ptr.isSet = true;
    proto._reader.capTable = brand._reader.capTable;
    proto._reader.segment = brand._reader.segment;
    proto._reader.data = brand._reader.data;
    proto._reader.pointers = brand._reader.pointers;
    proto._reader.dataSize = brand._reader.dataSize;
    proto._reader.pointerCount = brand._reader.pointerCount;
    proto._reader._38_2_ = brand._reader._38_2_;
    proto._reader.nestingLimit = brand._reader.nestingLimit;
    proto._reader._44_4_ = brand._reader._44_4_;
    local_80.reader.segment = (SegmentReader *)id;
    local_80.reader.capTable = (CapTableReader *)pOVar1;
    this_00 = Impl::makeBranded(*(Impl **)(id + 0x20),schema,proto,&local_48);
    kj::Locked<kj::Own<capnp::SchemaLoader::Impl>_>::~Locked
              ((Locked<kj::Own<capnp::SchemaLoader::Impl>_> *)&local_80);
    _::RawBrandedSchema::ensureInitialized(this_00);
    *(undefined1 *)&(this->impl).mutex.futex = 1;
    (this->impl).mutex.waitersHead.ptr = (Waiter *)this_00;
    aVar3 = extraout_RDX_01;
  }
LAB_00170040:
  MVar5.ptr.field_1 = aVar3;
  MVar5.ptr._0_8_ = this;
  return (Maybe<capnp::Schema>)MVar5.ptr;
}

Assistant:

kj::Maybe<Schema> SchemaLoader::tryGet(
    uint64_t id, schema::Brand::Reader brand, Schema scope) const {
  auto getResult = impl.lockShared()->get()->tryGet(id);
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // This schema couldn't be found or has yet to be lazily loaded. If we have a lazy loader
    // callback, invoke it now to try to get it to load this schema.
    KJ_IF_MAYBE(c, getResult.callback) {
      c->load(*this, id);
    }
    getResult = impl.lockShared()->get()->tryGet(id);
  }
  if (getResult.schema != nullptr && getResult.schema->lazyInitializer == nullptr) {
    if (brand.getScopes().size() > 0) {
      auto brandedSchema = impl.lockExclusive()->get()->makeBranded(
          getResult.schema, brand, kj::arrayPtr(scope.raw->scopes, scope.raw->scopeCount));
      brandedSchema->ensureInitialized();
      return Schema(brandedSchema);
    } else {
      return Schema(&getResult.schema->defaultBrand);
    }
  } else {
    return nullptr;
  }
}